

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void gola_close(LexState *ls,VarInfo *vg)

{
  uint pc_00;
  FuncState *fs_00;
  BCPos list;
  BCInsLine *pBVar1;
  BCPos next;
  BCIns *ip;
  BCPos pc;
  FuncState *fs;
  VarInfo *vg_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pc_00 = vg->startpc;
  pBVar1 = fs_00->bcbase + pc_00;
  *(uint8_t *)((long)&pBVar1->ins + 1) = vg->slot;
  if ((pBVar1->ins & 0xff) == 0x58) {
    list = jmp_next(fs_00,pc_00);
    if (list != 0xffffffff) {
      jmp_patch(fs_00,list,pc_00);
    }
    *(undefined1 *)&pBVar1->ins = 0x32;
    *(undefined2 *)((long)&pBVar1->ins + 2) = 0x7fff;
  }
  return;
}

Assistant:

static void gola_close(LexState *ls, VarInfo *vg)
{
  FuncState *fs = ls->fs;
  BCPos pc = vg->startpc;
  BCIns *ip = &fs->bcbase[pc].ins;
  lj_assertFS(gola_isgoto(vg), "expected goto");
  lj_assertFS(bc_op(*ip) == BC_JMP || bc_op(*ip) == BC_UCLO,
	      "bad bytecode op %d", bc_op(*ip));
  setbc_a(ip, vg->slot);
  if (bc_op(*ip) == BC_JMP) {
    BCPos next = jmp_next(fs, pc);
    if (next != NO_JMP) jmp_patch(fs, next, pc);  /* Jump to UCLO. */
    setbc_op(ip, BC_UCLO);  /* Turn into UCLO. */
    setbc_j(ip, NO_JMP);
  }
}